

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

void Gia_ManWriteMiniAig(Gia_Man_t *pGia,char *pFileName)

{
  Mini_Aig_t *p_00;
  Mini_Aig_t *p;
  char *pFileName_local;
  Gia_Man_t *pGia_local;
  
  p_00 = Gia_ManToMiniAig(pGia);
  Mini_AigDump(p_00,pFileName);
  Mini_AigStop(p_00);
  return;
}

Assistant:

void Gia_ManWriteMiniAig( Gia_Man_t * pGia, char * pFileName )
{
    Mini_Aig_t * p = Gia_ManToMiniAig( pGia );
    Mini_AigDump( p, pFileName );
    //Mini_AigDumpVerilog( "test_miniaig.v", "top", p );
    Mini_AigStop( p );
}